

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

size_t fiobj_str_concat(FIOBJ dest,FIOBJ obj)

{
  fio_str_s_conflict *s;
  ulong needed;
  byte bVar1;
  size_t __n;
  char *__src;
  char cVar2;
  fiobj_object_vtable_s *pfVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  fio_str_info_s o;
  fio_str_info_s local_58;
  fio_str_info_s local_40;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                  ,0x137,"size_t fiobj_str_concat(FIOBJ, FIOBJ)");
  }
  uVar7 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar7 + 0x11) != '\0') {
    return 0;
  }
  *(undefined8 *)(uVar7 + 8) = 0;
  if (obj == 0) {
LAB_001208c5:
    local_58.data = anon_var_dwarf_1dd;
    local_58.len._0_4_ = 4;
    goto LAB_001208d8;
  }
  if ((obj & 1) == 0) {
    uVar5 = (uint)obj & 6;
    cVar2 = '(';
    switch(uVar5) {
    case 0:
switchD_00120894_caseD_0:
      cVar2 = *(char *)(obj & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00120894_caseD_4:
      cVar2 = '*';
      break;
    case 6:
      if ((char)obj == '&') {
        local_58.data = anon_var_dwarf_1e8;
        local_58.len._0_4_ = 5;
      }
      else {
        uVar6 = (uint)obj & 0xff;
        if (uVar6 != 0x16) {
          if (uVar6 == 6) goto LAB_001208c5;
          switch(uVar5) {
          case 0:
            goto switchD_00120894_caseD_0;
          case 4:
            goto switchD_00120894_caseD_4;
          case 6:
            cVar2 = (char)obj;
          }
          break;
        }
        local_58.data = anon_var_dwarf_1f3;
        local_58.len._0_4_ = 4;
      }
LAB_001208d8:
      local_58.capa._0_4_ = 0;
      local_58.capa._4_4_ = 0;
      local_58.len._4_4_ = 0;
      goto LAB_00120972;
    }
    switch(cVar2) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar3 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar3 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar3->to_str)(&local_58,obj);
  }
  else {
    fio_ltocstr(&local_58,(long)obj >> 1);
  }
LAB_00120972:
  __src = local_58.data;
  s = (fio_str_s_conflict *)(uVar7 + 0x10);
  __n = CONCAT44(local_58.len._4_4_,(undefined4)local_58.len);
  if (((__n == 0) || (local_58.data == (char *)0x0)) || (*(char *)(uVar7 + 0x11) != '\0')) {
    if ((s->small == 0) && (*(long *)(uVar7 + 0x38) != 0)) {
      return *(size_t *)(uVar7 + 0x28);
    }
    return (ulong)(s->small >> 1);
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (*(long *)(uVar7 + 0x38) != 0)) {
    uVar9 = *(ulong *)(uVar7 + 0x28);
  }
  else {
    uVar9 = (ulong)(bVar1 >> 1);
  }
  needed = __n + uVar9;
  if ((bVar1 == 0) && (*(long *)(uVar7 + 0x38) != 0)) {
    uVar4 = *(ulong *)(uVar7 + 0x20);
    if (uVar4 <= needed) {
      if (*(long *)(uVar7 + 0x30) == 0) {
        uVar4 = *(ulong *)(uVar7 + 0x28);
      }
      *(ulong *)(uVar7 + 0x28) = uVar4;
      goto LAB_00120a14;
    }
  }
  else {
    if (needed < 0x2e) {
      *(char *)(uVar7 + 0x10) = (char)needed * '\x02' + '\x01';
      *(undefined1 *)(uVar7 + 0x12 + needed) = 0;
      lVar8 = uVar7 + 0x12;
      goto LAB_00120a32;
    }
    s->small = '[';
LAB_00120a14:
    fio_str_capa_assert(&local_40,s,needed);
  }
  *(ulong *)(uVar7 + 0x28) = needed;
  *(undefined1 *)(*(long *)(uVar7 + 0x38) + needed) = 0;
  lVar8 = *(long *)(uVar7 + 0x38);
LAB_00120a32:
  memcpy((void *)(lVar8 + uVar9),__src,__n);
  return needed;
}

Assistant:

size_t fiobj_str_concat(FIOBJ dest, FIOBJ obj) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s o = fiobj_obj2cstr(obj);
  if (o.len == 0)
    return fio_str_len(&obj2str(dest)->str);
  return fio_str_write(&obj2str(dest)->str, o.data, o.len).len;
}